

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_sub_string(JSContext *ctx,JSString *p,int start,int end)

{
  ulong in_RAX;
  long lVar1;
  ushort uVar2;
  ulong uVar3;
  uint max_len;
  ulong uVar4;
  JSRefCountHeader *p_1;
  JSValue JVar5;
  JSValueUnion local_28;
  
  if ((start == 0) && ((*(uint *)&p->field_0x4 & 0x7fffffff) == end)) {
    (p->header).ref_count = (p->header).ref_count + 1;
    local_28 = (JSValueUnion)p;
LAB_0012f03a:
    JVar5.tag = -7;
    JVar5.u.ptr = local_28.ptr;
  }
  else {
    max_len = end - start;
    if ((int)max_len < 1 || (p->field_0x7 & 0x80) == 0) {
      JVar5 = js_new_string8(ctx,(uint8_t *)((long)&p[1].header.ref_count + (long)start),max_len);
      return JVar5;
    }
    if (start < end) {
      lVar1 = (long)start;
      uVar2 = 0;
      do {
        uVar2 = uVar2 | *(ushort *)((long)&p[1].header.ref_count + lVar1 * 2);
        lVar1 = lVar1 + 1;
      } while (end != lVar1);
      if (uVar2 < 0x100) goto LAB_0012f0da;
      local_28.ptr = js_alloc_string(ctx,max_len,1);
      if ((JSString *)local_28.ptr != (JSString *)0x0) {
        memcpy((JSString *)((long)local_28.ptr + 0x10),
               (void *)((long)&p[1].header.ref_count + (long)start * 2),(ulong)(max_len * 2));
        goto LAB_0012f03a;
      }
    }
    else {
LAB_0012f0da:
      local_28.ptr = js_alloc_string(ctx,max_len,0);
      if ((JSString *)local_28.ptr != (JSString *)0x0) {
        uVar3 = 1;
        if (1 < (int)max_len) {
          uVar3 = (ulong)max_len;
        }
        uVar4 = 0;
        do {
          *(undefined1 *)((long)local_28.ptr + uVar4 + 0x10) =
               *(undefined1 *)((long)&p[1].header.ref_count + uVar4 * 2 + (long)start * 2);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        *(undefined1 *)((long)local_28.ptr + (ulong)max_len + 0x10) = 0;
        goto LAB_0012f03a;
      }
    }
    local_28.ptr = (void *)(in_RAX & 0xffffffff00000000);
    JVar5.tag = 6;
    JVar5.u.ptr = local_28.ptr;
  }
  return JVar5;
}

Assistant:

static JSValue js_sub_string(JSContext *ctx, JSString *p, int start, int end)
{
    int len = end - start;
    if (start == 0 && end == p->len) {
        return JS_DupValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
    }
    if (p->is_wide_char && len > 0) {
        JSString *str;
        int i;
        uint16_t c = 0;
        for (i = start; i < end; i++) {
            c |= p->u.str16[i];
        }
        if (c > 0xFF)
            return js_new_string16(ctx, p->u.str16 + start, len);

        str = js_alloc_string(ctx, len, 0);
        if (!str)
            return JS_EXCEPTION;
        for (i = 0; i < len; i++) {
            str->u.str8[i] = p->u.str16[start + i];
        }
        str->u.str8[len] = '\0';
        return JS_MKPTR(JS_TAG_STRING, str);
    } else {
        return js_new_string8(ctx, p->u.str8 + start, len);
    }
}